

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pusher.cpp
# Opt level: O0

void push_boris(particle *p,vector3d *e_field,vector3d *b_field,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double *g;
  double *uz;
  double *uy;
  double *ux;
  double *cmr;
  double wz;
  double wy;
  double wx;
  double u1z;
  double u1y;
  double u1x;
  double tmp;
  vector3d b;
  vector3d e;
  vector3d local_50;
  vector3d local_38;
  double local_20;
  double *local_18;
  double *local_10;
  long local_8;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vector3d::vector3d(&local_38);
  vector3d::vector3d(&local_50);
  pdVar4 = (double *)(local_8 + 0x18);
  pdVar5 = (double *)(local_8 + 0x20);
  pdVar6 = (double *)(local_8 + 0x28);
  pdVar7 = (double *)(local_8 + 0x30);
  dVar9 = local_20 * 0.5 * *(double *)(local_8 + 0x40);
  local_38.x = *local_10 * dVar9;
  local_38.y = local_10[1] * dVar9;
  local_38.z = local_10[2] * dVar9;
  dVar10 = *pdVar4 + local_38.x;
  dVar1 = *pdVar5 + local_38.y;
  dVar2 = *pdVar6 + local_38.z;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar10;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar10;
  auVar11 = vfmadd213sd_fma(auVar26,auVar11,ZEXT816(0x3ff0000000000000));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1;
  auVar11 = vfmadd213sd_fma(auVar38,auVar12,auVar11);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar11 = vfmadd213sd_fma(auVar13,auVar27,auVar11);
  dVar8 = sqrt(auVar11._0_8_);
  *pdVar7 = dVar8;
  dVar9 = dVar9 / *pdVar7;
  local_50.x = *local_18 * dVar9;
  local_50.y = local_18[1] * dVar9;
  local_50.z = local_18[2] * dVar9;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_50.z;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -(dVar2 * local_50.y);
  auVar11 = vfmadd213sd_fma(auVar28,auVar39,auVar50);
  dVar9 = dVar10 + auVar11._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_50.x;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = -(dVar10 * local_50.z);
  auVar11 = vfmadd213sd_fma(auVar29,auVar40,auVar51);
  dVar8 = dVar1 + auVar11._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar10;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_50.y;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = -(dVar1 * local_50.x);
  auVar11 = vfmadd213sd_fma(auVar30,auVar41,auVar52);
  dVar3 = dVar2 + auVar11._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_50.x;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_50.x;
  auVar11 = vfmadd213sd_fma(auVar31,auVar14,ZEXT816(0x3ff0000000000000));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_50.y;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_50.y;
  auVar11 = vfmadd213sd_fma(auVar42,auVar15,auVar11);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_50.z;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_50.z;
  auVar11 = vfmadd213sd_fma(auVar32,auVar16,auVar11);
  auVar18._0_8_ = 2.0 / auVar11._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar8;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_50.z;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -(dVar3 * local_50.y);
  auVar11 = vfmadd213sd_fma(auVar33,auVar17,auVar43);
  auVar18._8_8_ = 0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar10;
  auVar11 = vfmadd213sd_fma(auVar18,auVar11,auVar44);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_50.x;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -(dVar9 * local_50.z);
  auVar12 = vfmadd213sd_fma(auVar34,auVar19,auVar45);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar18._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1;
  auVar12 = vfmadd213sd_fma(auVar20,auVar12,auVar46);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar9;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_50.y;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -(dVar8 * local_50.x);
  auVar13 = vfmadd213sd_fma(auVar35,auVar21,auVar47);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar18._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar2;
  auVar13 = vfmadd213sd_fma(auVar22,auVar13,auVar48);
  *pdVar4 = auVar11._0_8_ + local_38.x;
  *pdVar5 = auVar12._0_8_ + local_38.y;
  *pdVar6 = auVar13._0_8_ + local_38.z;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pdVar4;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pdVar4;
  auVar11 = vfmadd213sd_fma(auVar36,auVar23,ZEXT816(0x3ff0000000000000));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pdVar5;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar5;
  auVar11 = vfmadd213sd_fma(auVar49,auVar24,auVar11);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pdVar6;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pdVar6;
  auVar11 = vfmadd213sd_fma(auVar25,auVar37,auVar11);
  dVar10 = sqrt(auVar11._0_8_);
  *pdVar7 = dVar10;
  return;
}

Assistant:

void push_boris(particle & p, vector3d& e_field, vector3d& b_field, double dt)
{
    // See Birdsall, Langdon, "Plasma Physics via Computer Simulation"
    vector3d e;
    vector3d b;
    double tmp;
    double u1x, u1y, u1z;
    double wx,wy,wz;
    double & cmr = p.cmr;
    double & ux = p.ux;
    double & uy = p.uy;
    double & uz = p.uz;
    double & g = p.g;
    tmp = 0.5 * dt * cmr;

    //e = dt qE/2m
    e.x = e_field.x*tmp;
    e.y = e_field.y*tmp;
    e.z = e_field.z*tmp;
    //

    // u- = u0 + e
    u1x = ux + e.x;
    u1y = uy + e.y;
    u1z = uz + e.z;

    // gamma^2 = 1 + (u-)^2
    g = sqrt(1 + u1x * u1x + u1y * u1y + u1z * u1z);

    tmp /= g;
    // b = dt qB/2mc
    b.x = b_field.x*tmp;
    b.y = b_field.y*tmp;
    b.z = b_field.z*tmp;

    // u' = u- + [u-, b]
    wx = u1x + (u1y * b.z - u1z * b.y);
    wy = u1y + (u1z * b.x - u1x * b.z);
    wz = u1z + (u1x * b.y - u1y * b.x);

    tmp = 2 / (1 + b.x * b.x + b.y * b.y + b.z * b.z);

    // u+ = u- + 2 * [u, b] / (1 + b^2)
    u1x += (wy * b.z - wz * b.y) * tmp;
    u1y += (wz * b.x - wx * b.z) * tmp;
    u1z += (wx * b.y - wy * b.x) * tmp;

    // u1 = u+ + e
    ux = u1x + e.x;
    uy = u1y + e.y;
    uz = u1z + e.z;

    g = sqrt(1 + ux * ux + uy * uy + uz * uz);
}